

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_cache.c
# Opt level: O2

int mbedtls_ssl_cache_set(void *data,mbedtls_ssl_session *session)

{
  mbedtls_x509_crt *pmVar1;
  size_t __size;
  int iVar2;
  time_t tVar3;
  long *plVar4;
  long *plVar5;
  void *__dest;
  long *plVar6;
  long *plVar7;
  long lVar8;
  int iVar9;
  
  lVar8 = 0;
  tVar3 = time((time_t *)0x0);
  plVar6 = (long *)0x0;
  iVar9 = 0;
  plVar4 = (long *)data;
  plVar7 = (long *)0x0;
  while (plVar5 = (long *)*plVar4, plVar5 != (long *)0x0) {
    if ((*(int *)((long)data + 8) != 0) && (*(int *)((long)data + 8) < (int)tVar3 - (int)*plVar5))
    goto LAB_00111404;
    iVar2 = bcmp(session->id,plVar5 + 4,plVar5[3]);
    if (iVar2 == 0) goto LAB_0011140f;
    if (*plVar5 < lVar8 || lVar8 == 0) {
      plVar6 = plVar5;
      lVar8 = *plVar5;
    }
    iVar9 = iVar9 + 1;
    plVar7 = plVar5;
    plVar4 = plVar5 + 0x17;
  }
  if (iVar9 < *(int *)((long)data + 0xc)) {
    plVar5 = (long *)calloc(1,0xc0);
    if (plVar5 == (long *)0x0) {
      return 1;
    }
    plVar4 = plVar7 + 0x17;
    if (plVar7 == (long *)0x0) {
      plVar4 = (long *)data;
    }
    *plVar4 = (long)plVar5;
  }
  else {
    plVar5 = plVar6;
    if (plVar6 == (long *)0x0) {
      return 1;
    }
  }
LAB_00111404:
  *plVar5 = tVar3;
LAB_0011140f:
  memcpy(plVar5 + 1,session,0x98);
  if ((void *)plVar5[0x16] != (void *)0x0) {
    free((void *)plVar5[0x16]);
    plVar5[0x14] = 0;
    plVar5[0x15] = 0;
    plVar5[0x16] = 0;
  }
  pmVar1 = session->peer_cert;
  if (pmVar1 != (mbedtls_x509_crt *)0x0) {
    __size = (pmVar1->raw).len;
    __dest = calloc(1,__size);
    plVar5[0x16] = (long)__dest;
    if (__dest == (void *)0x0) {
      return 1;
    }
    memcpy(__dest,(pmVar1->raw).p,__size);
    plVar5[0x15] = __size;
    plVar5[0xe] = 0;
  }
  return 0;
}

Assistant:

int mbedtls_ssl_cache_set( void *data, const mbedtls_ssl_session *session )
{
    int ret = 1;
#if defined(MBEDTLS_HAVE_TIME)
    mbedtls_time_t t = mbedtls_time( NULL ), oldest = 0;
    mbedtls_ssl_cache_entry *old = NULL;
#endif
    mbedtls_ssl_cache_context *cache = (mbedtls_ssl_cache_context *) data;
    mbedtls_ssl_cache_entry *cur, *prv;
    int count = 0;

#if defined(MBEDTLS_THREADING_C)
    if( ( ret = mbedtls_mutex_lock( &cache->mutex ) ) != 0 )
        return( ret );
#endif

    cur = cache->chain;
    prv = NULL;

    while( cur != NULL )
    {
        count++;

#if defined(MBEDTLS_HAVE_TIME)
        if( cache->timeout != 0 &&
            (int) ( t - cur->timestamp ) > cache->timeout )
        {
            cur->timestamp = t;
            break; /* expired, reuse this slot, update timestamp */
        }
#endif

        if( memcmp( session->id, cur->session.id, cur->session.id_len ) == 0 )
            break; /* client reconnected, keep timestamp for session id */

#if defined(MBEDTLS_HAVE_TIME)
        if( oldest == 0 || cur->timestamp < oldest )
        {
            oldest = cur->timestamp;
            old = cur;
        }
#endif

        prv = cur;
        cur = cur->next;
    }

    if( cur == NULL )
    {
#if defined(MBEDTLS_HAVE_TIME)
        /*
         * Reuse oldest entry if max_entries reached
         */
        if( count >= cache->max_entries )
        {
            if( old == NULL )
            {
                ret = 1;
                goto exit;
            }

            cur = old;
        }
#else /* MBEDTLS_HAVE_TIME */
        /*
         * Reuse first entry in chain if max_entries reached,
         * but move to last place
         */
        if( count >= cache->max_entries )
        {
            if( cache->chain == NULL )
            {
                ret = 1;
                goto exit;
            }

            cur = cache->chain;
            cache->chain = cur->next;
            cur->next = NULL;
            prv->next = cur;
        }
#endif /* MBEDTLS_HAVE_TIME */
        else
        {
            /*
             * max_entries not reached, create new entry
             */
            cur = mbedtls_calloc( 1, sizeof(mbedtls_ssl_cache_entry) );
            if( cur == NULL )
            {
                ret = 1;
                goto exit;
            }

            if( prv == NULL )
                cache->chain = cur;
            else
                prv->next = cur;
        }

#if defined(MBEDTLS_HAVE_TIME)
        cur->timestamp = t;
#endif
    }